

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_AssertionTest_x_iutest_x_False_Test::Body(iu_AssertionTest_x_iutest_x_False_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_1270;
  AssertionHelper local_1250;
  Fixed local_1220;
  bool local_1091;
  undefined1 local_1090 [8];
  AssertionResult iutest_ar_8;
  AssertionHelper local_1048;
  Fixed local_1018;
  bool local_e89;
  undefined1 local_e88 [8];
  AssertionResult iutest_ar_7;
  AssertionHelper local_e40;
  Fixed local_e10;
  bool local_c81;
  undefined1 local_c80 [8];
  AssertionResult iutest_ar_6;
  AssertionHelper local_c38;
  Fixed local_c08;
  bool local_a79;
  undefined1 local_a78 [8];
  AssertionResult iutest_ar_5;
  AssertionHelper local_a30;
  Fixed local_a00;
  bool local_871;
  undefined1 local_870 [8];
  AssertionResult iutest_ar_4;
  AssertionHelper local_828;
  Fixed local_7f8;
  bool local_669;
  undefined1 local_668 [8];
  AssertionResult iutest_ar_3;
  AssertionHelper local_620;
  Fixed local_5f0;
  bool local_461;
  undefined1 local_460 [8];
  AssertionResult iutest_ar_2;
  AssertionHelper local_418;
  Fixed local_3e8;
  bool local_259;
  undefined1 local_258 [8];
  AssertionResult iutest_ar_1;
  string local_228;
  AssertionHelper local_208;
  Fixed local_1d8;
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_AssertionTest_x_iutest_x_False_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_39 = true;
  iutest::AssertionResult::Is<bool>((AssertionResult *)local_38,&local_39);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_228,(internal *)local_38,(AssertionResult *)"false","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
               ,0x2f,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    local_259 = true;
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_258,&local_259);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar1) {
      memset(&local_3e8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3e8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)&iutest_ar_2.m_result,(internal *)local_258,(AssertionResult *)"false",
                 "true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_418,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0x30,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_418,&local_3e8);
      iutest::AssertionHelper::~AssertionHelper(&local_418);
      std::__cxx11::string::~string((string *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3e8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_258);
    iutest::detail::AlwaysZero();
    local_461 = true;
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_460,&local_461);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
    if (!bVar1) {
      memset(&local_5f0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5f0);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)&iutest_ar_3.m_result,(internal *)local_460,(AssertionResult *)"false",
                 "true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_620,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0x31,pcVar2,kWarning);
      iutest::AssertionHelper::operator=(&local_620,&local_5f0);
      iutest::AssertionHelper::~AssertionHelper(&local_620);
      std::__cxx11::string::~string((string *)&iutest_ar_3.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5f0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_460);
    iutest::detail::AlwaysZero();
    local_669 = true;
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_668,&local_669);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
    if (!bVar1) {
      memset(&local_7f8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_7f8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)&iutest_ar_4.m_result,(internal *)local_668,(AssertionResult *)0x544afc,
                 "true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_828,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0x32,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_828,&local_7f8);
      iutest::AssertionHelper::~AssertionHelper(&local_828);
      std::__cxx11::string::~string((string *)&iutest_ar_4.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_7f8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_668);
    iutest::detail::AlwaysZero();
    local_871 = true;
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_870,&local_871);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_870);
    if (!bVar1) {
      memset(&local_a00,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_a00);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)&iutest_ar_5.m_result,(internal *)local_870,(AssertionResult *)"100!=100"
                 ,"true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_a30,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0x33,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_a30,&local_a00);
      iutest::AssertionHelper::~AssertionHelper(&local_a30);
      std::__cxx11::string::~string((string *)&iutest_ar_5.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_a00);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_870);
    iutest::detail::AlwaysZero();
    local_a79 = true;
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_a78,&local_a79);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a78);
    if (!bVar1) {
      memset(&local_c08,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_c08);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)&iutest_ar_6.m_result,(internal *)local_a78,
                 (AssertionResult *)"add_t<0, 0>::value","true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_c38,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0x35,pcVar2,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_c38,&local_c08);
      iutest::AssertionHelper::~AssertionHelper(&local_c38);
      std::__cxx11::string::~string((string *)&iutest_ar_6.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_c08);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_a78);
    if (iutest_ar_1._36_4_ == 0) {
      iutest::detail::AlwaysZero();
      local_c81 = true;
      iutest::AssertionResult::Is<bool>((AssertionResult *)local_c80,&local_c81);
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c80);
      if (!bVar1) {
        memset(&local_e10,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_e10);
        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                  ((string *)&iutest_ar_7.m_result,(internal *)local_c80,
                   (AssertionResult *)"add_t<0, 0>::value","true","false",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        iutest::AssertionHelper::AssertionHelper
                  (&local_e40,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                   ,0x36,pcVar2,kNonFatalFailure);
        iutest::AssertionHelper::operator=(&local_e40,&local_e10);
        iutest::AssertionHelper::~AssertionHelper(&local_e40);
        std::__cxx11::string::~string((string *)&iutest_ar_7.m_result);
        iutest::AssertionHelper::Fixed::~Fixed(&local_e10);
      }
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_c80);
      iutest::detail::AlwaysZero();
      local_e89 = true;
      iutest::AssertionResult::Is<bool>((AssertionResult *)local_e88,&local_e89);
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e88);
      if (!bVar1) {
        memset(&local_1018,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_1018);
        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                  ((string *)&iutest_ar_8.m_result,(internal *)local_e88,
                   (AssertionResult *)"add_t<0, 0>::value","true","false",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        iutest::AssertionHelper::AssertionHelper
                  (&local_1048,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                   ,0x37,pcVar2,kWarning);
        iutest::AssertionHelper::operator=(&local_1048,&local_1018);
        iutest::AssertionHelper::~AssertionHelper(&local_1048);
        std::__cxx11::string::~string((string *)&iutest_ar_8.m_result);
        iutest::AssertionHelper::Fixed::~Fixed(&local_1018);
      }
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_e88);
      iutest::detail::AlwaysZero();
      local_1091 = true;
      iutest::AssertionResult::Is<bool>((AssertionResult *)local_1090,&local_1091);
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1090);
      if (!bVar1) {
        memset(&local_1220,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_1220);
        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                  (&local_1270,(internal *)local_1090,(AssertionResult *)"add_t<0, 0>::value","true"
                   ,"false",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        iutest::AssertionHelper::AssertionHelper
                  (&local_1250,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                   ,0x38,pcVar2,kAssumeFailure);
        iutest::AssertionHelper::operator=(&local_1250,&local_1220);
        iutest::AssertionHelper::~AssertionHelper(&local_1250);
        std::__cxx11::string::~string((string *)&local_1270);
        iutest::AssertionHelper::Fixed::~Fixed(&local_1220);
      }
      iutest_ar_1._37_3_ = 0;
      iutest_ar_1._36_1_ = !bVar1;
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1090);
    }
  }
  return;
}

Assistant:

IUTEST(AssertionTest, False)
{
    IUTEST_ASSERT_FALSE(false);
    IUTEST_EXPECT_FALSE(false);
    IUTEST_INFORM_FALSE(false);
    IUTEST_EXPECT_FALSE(0);
    IUTEST_EXPECT_FALSE(100!=100);
#if !defined(IUTEST_NO_VARIADIC_MACROS)
    IUTEST_ASSERT_FALSE(add_t<0, 0>::value);
    IUTEST_EXPECT_FALSE(add_t<0, 0>::value);
    IUTEST_INFORM_FALSE(add_t<0, 0>::value);
    IUTEST_ASSUME_FALSE(add_t<0, 0>::value);
#endif
}